

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O2

PartialPolicyPoolInterface * __thiscall
PolicyPoolPartialJPolValPair::operator=
          (PolicyPoolPartialJPolValPair *this,PartialPolicyPoolInterface *o)

{
  PolicyPoolPartialJPolValPair *o_00;
  
  if (this != (PolicyPoolPartialJPolValPair *)o) {
    o_00 = (PolicyPoolPartialJPolValPair *)
           __dynamic_cast(o,&PartialPolicyPoolInterface::typeinfo,&typeinfo,0);
    if (o_00 == (PolicyPoolPartialJPolValPair *)0x0) {
      __cxa_bad_cast();
    }
    operator=(this,o_00);
  }
  return &this->super_PartialPolicyPoolInterface;
}

Assistant:

PartialPolicyPoolInterface& PolicyPoolPartialJPolValPair::operator= 
    (const PartialPolicyPoolInterface& o)
{
    if(DEBUG_PPJPVP_ASSIGN)
        cout <<"PartialPolicyPoolInterface& PolicyPoolPartialJPolValPair::operator= \
called."<<endl;
    if (this == &o) return *this;   // Gracefully handle self assignment
    const PolicyPoolPartialJPolValPair& casted_o = 
        dynamic_cast<const PolicyPoolPartialJPolValPair&>(o);

    return(operator=(casted_o));

}